

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTargetInternals::cmTargetInternals(cmTargetInternals *this)

{
  _Rb_tree_header *p_Var1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  undefined8 local_a8;
  char *pcStack_a0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  undefined8 local_80;
  char *pcStack_78;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  undefined8 local_58;
  char *pcStack_50;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  (this->PolicyMap).Status.super__Base_bitset<8UL>._M_w[6] = 0;
  (this->PolicyMap).Status.super__Base_bitset<8UL>._M_w[7] = 0;
  (this->PolicyMap).Status.super__Base_bitset<8UL>._M_w[4] = 0;
  (this->PolicyMap).Status.super__Base_bitset<8UL>._M_w[5] = 0;
  (this->PolicyMap).Status.super__Base_bitset<8UL>._M_w[2] = 0;
  (this->PolicyMap).Status.super__Base_bitset<8UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<8UL>._M_w[0] = 0;
  (this->PolicyMap).Status.super__Base_bitset<8UL>._M_w[1] = 0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->InstallPath)._M_dataplus._M_p = (pointer)&(this->InstallPath).field_2;
  (this->InstallPath)._M_string_length = 0;
  (this->InstallPath).field_2._M_local_buf[0] = '\0';
  (this->RuntimeInstallPath)._M_dataplus._M_p = (pointer)&(this->RuntimeInstallPath).field_2;
  (this->RuntimeInstallPath)._M_string_length = 0;
  (this->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  (this->Properties).Map_._M_h._M_buckets = &(this->Properties).Map_._M_h._M_single_bucket;
  (this->Properties).Map_._M_h._M_bucket_count = 1;
  (this->Properties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Properties).Map_._M_h._M_element_count = 0;
  (this->Properties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Properties).Map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Properties).Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->InstallGenerators).
  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->FileSets)._M_t._M_impl.super__Rb_tree_header;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  cmConstStack<cmFindPackageCall,_cmFindPackageStack>::cmConstStack
            (&(this->FindPackageStack).super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
  (this->IncludeDirectories).Name.super_string_view._M_len = 0x13;
  (this->IncludeDirectories).Name.super_string_view._M_str = "INCLUDE_DIRECTORIES";
  (this->IncludeDirectories).AppendBehavior = No;
  (this->IncludeDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->IncludeDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IncludeDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CompileOptions).Name.super_string_view._M_len = 0xf;
  (this->CompileOptions).Name.super_string_view._M_str = "COMPILE_OPTIONS";
  (this->CompileOptions).AppendBehavior = No;
  (this->CompileOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CompileOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CompileOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CompileFeatures).Name.super_string_view._M_len = 0x10;
  (this->CompileFeatures).Name.super_string_view._M_str = "COMPILE_FEATURES";
  (this->CompileFeatures).AppendBehavior = No;
  (this->CompileFeatures).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CompileFeatures).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CompileFeatures).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CompileDefinitions).Name.super_string_view._M_len = 0x13;
  (this->CompileDefinitions).Name.super_string_view._M_str = "COMPILE_DEFINITIONS";
  (this->CompileDefinitions).AppendBehavior = No;
  (this->CompileDefinitions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CompileDefinitions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CompileDefinitions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PrecompileHeaders).Name.super_string_view._M_len = 0x12;
  (this->PrecompileHeaders).Name.super_string_view._M_str = "PRECOMPILE_HEADERS";
  (this->PrecompileHeaders).AppendBehavior = No;
  (this->PrecompileHeaders).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PrecompileHeaders).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PrecompileHeaders).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Sources).Name.super_string_view._M_len = 7;
  (this->Sources).Name.super_string_view._M_str = "SOURCES";
  (this->Sources).AppendBehavior = Yes;
  (this->Sources).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Sources).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Sources).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkOptions).Name.super_string_view._M_len = 0xc;
  (this->LinkOptions).Name.super_string_view._M_str = "LINK_OPTIONS";
  (this->LinkOptions).AppendBehavior = No;
  (this->LinkOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkDirectories).Name.super_string_view._M_len = 0x10;
  (this->LinkDirectories).Name.super_string_view._M_str = "LINK_DIRECTORIES";
  (this->LinkDirectories).AppendBehavior = No;
  (this->LinkDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkLibraries).Name.super_string_view._M_len = 0xe;
  (this->LinkLibraries).Name.super_string_view._M_str = "LINK_LIBRARIES";
  (this->LinkLibraries).AppendBehavior = No;
  (this->LinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InterfaceLinkLibraries).Name.super_string_view._M_len = 0x18;
  (this->InterfaceLinkLibraries).Name.super_string_view._M_str = "INTERFACE_LINK_LIBRARIES";
  (this->InterfaceLinkLibraries).AppendBehavior = No;
  (this->InterfaceLinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InterfaceLinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InterfaceLinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InterfaceLinkLibrariesDirect).Name.super_string_view._M_len = 0x1f;
  (this->InterfaceLinkLibrariesDirect).Name.super_string_view._M_str =
       "INTERFACE_LINK_LIBRARIES_DIRECT";
  (this->InterfaceLinkLibrariesDirect).AppendBehavior = No;
  (this->InterfaceLinkLibrariesDirect).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InterfaceLinkLibrariesDirect).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InterfaceLinkLibrariesDirect).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InterfaceLinkLibrariesDirectExclude).Name.super_string_view._M_len = 0x27;
  (this->InterfaceLinkLibrariesDirectExclude).Name.super_string_view._M_str =
       "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE";
  (this->InterfaceLinkLibrariesDirectExclude).AppendBehavior = No;
  (this->InterfaceLinkLibrariesDirectExclude).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InterfaceLinkLibrariesDirectExclude).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InterfaceLinkLibrariesDirectExclude).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedCxxModulesIncludeDirectories).Name.super_string_view._M_len = 0x28;
  (this->ImportedCxxModulesIncludeDirectories).Name.super_string_view._M_str =
       "IMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES";
  (this->ImportedCxxModulesIncludeDirectories).AppendBehavior = No;
  (this->ImportedCxxModulesIncludeDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImportedCxxModulesIncludeDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImportedCxxModulesIncludeDirectories).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedCxxModulesCompileDefinitions).Name.super_string_view._M_len = 0x28;
  (this->ImportedCxxModulesCompileDefinitions).Name.super_string_view._M_str =
       "IMPORTED_CXX_MODULES_COMPILE_DEFINITIONS";
  (this->ImportedCxxModulesCompileDefinitions).AppendBehavior = No;
  (this->ImportedCxxModulesCompileDefinitions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImportedCxxModulesCompileDefinitions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImportedCxxModulesCompileDefinitions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedCxxModulesCompileFeatures).Name.super_string_view._M_len = 0x25;
  (this->ImportedCxxModulesCompileFeatures).Name.super_string_view._M_str =
       "IMPORTED_CXX_MODULES_COMPILE_FEATURES";
  (this->ImportedCxxModulesCompileFeatures).AppendBehavior = No;
  (this->ImportedCxxModulesCompileFeatures).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImportedCxxModulesCompileFeatures).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImportedCxxModulesCompileFeatures).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedCxxModulesCompileOptions).Name.super_string_view._M_len = 0x24;
  (this->ImportedCxxModulesCompileOptions).Name.super_string_view._M_str =
       "IMPORTED_CXX_MODULES_COMPILE_OPTIONS";
  (this->ImportedCxxModulesCompileOptions).AppendBehavior = No;
  (this->ImportedCxxModulesCompileOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImportedCxxModulesCompileOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImportedCxxModulesCompileOptions).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedCxxModulesLinkLibraries).Name.super_string_view._M_len = 0x23;
  (this->ImportedCxxModulesLinkLibraries).Name.super_string_view._M_str =
       "IMPORTED_CXX_MODULES_LINK_LIBRARIES";
  (this->ImportedCxxModulesLinkLibraries).AppendBehavior = No;
  (this->ImportedCxxModulesLinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImportedCxxModulesLinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImportedCxxModulesLinkLibraries).Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = 0xb;
  pcStack_50 = "HEADER_SETS";
  local_80 = 0x15;
  pcStack_78 = "INTERFACE_HEADER_SETS";
  (this->HeadersFileSets).TypeName.super_string_view._M_len = 7;
  (this->HeadersFileSets).TypeName.super_string_view._M_str = "HEADERS";
  (this->HeadersFileSets).DefaultDirectoryProperty.super_string_view._M_len = 0xb;
  (this->HeadersFileSets).DefaultDirectoryProperty.super_string_view._M_str = "HEADER_DIRS";
  (this->HeadersFileSets).DefaultPathProperty.super_string_view._M_len = 10;
  (this->HeadersFileSets).DefaultPathProperty.super_string_view._M_str = "HEADER_SET";
  (this->HeadersFileSets).DirectoryPrefix.super_string_view._M_len = 0xc;
  (this->HeadersFileSets).DirectoryPrefix.super_string_view._M_str = "HEADER_DIRS_";
  (this->HeadersFileSets).PathPrefix.super_string_view._M_len = 0xb;
  (this->HeadersFileSets).PathPrefix.super_string_view._M_str = "HEADER_SET_";
  (this->HeadersFileSets).TypeDescription.super_string_view._M_len = 6;
  (this->HeadersFileSets).TypeDescription.super_string_view._M_str = "Header";
  (this->HeadersFileSets).DefaultDescription.super_string_view._M_len = 0x16;
  (this->HeadersFileSets).DefaultDescription.super_string_view._M_str = "The default header set";
  (this->HeadersFileSets).ArbitraryDescription.super_string_view._M_len = 10;
  (this->HeadersFileSets).ArbitraryDescription.super_string_view._M_str = "Header set";
  (this->HeadersFileSets).SelfEntries.PropertyName.super_string_view._M_len = 0xb;
  (this->HeadersFileSets).SelfEntries.PropertyName.super_string_view._M_str = "HEADER_SETS";
  (this->HeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeadersFileSets).InterfaceEntries.PropertyName.super_string_view._M_len = 0x15;
  (this->HeadersFileSets).InterfaceEntries.PropertyName.super_string_view._M_str =
       "INTERFACE_HEADER_SETS";
  (this->HeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_70);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  local_a8 = 0xf;
  pcStack_a0 = "CXX_MODULE_SETS";
  (this->CxxModulesFileSets).TypeName.super_string_view._M_len = 0xb;
  (this->CxxModulesFileSets).TypeName.super_string_view._M_str = "CXX_MODULES";
  (this->CxxModulesFileSets).DefaultDirectoryProperty.super_string_view._M_len = 0xf;
  (this->CxxModulesFileSets).DefaultDirectoryProperty.super_string_view._M_str = "CXX_MODULE_DIRS";
  (this->CxxModulesFileSets).DefaultPathProperty.super_string_view._M_len = 0xe;
  (this->CxxModulesFileSets).DefaultPathProperty.super_string_view._M_str = "CXX_MODULE_SET";
  (this->CxxModulesFileSets).DirectoryPrefix.super_string_view._M_len = 0x10;
  (this->CxxModulesFileSets).DirectoryPrefix.super_string_view._M_str = "CXX_MODULE_DIRS_";
  (this->CxxModulesFileSets).PathPrefix.super_string_view._M_len = 0xf;
  (this->CxxModulesFileSets).PathPrefix.super_string_view._M_str = "CXX_MODULE_SET_";
  (this->CxxModulesFileSets).TypeDescription.super_string_view._M_len = 10;
  (this->CxxModulesFileSets).TypeDescription.super_string_view._M_str = "C++ module";
  (this->CxxModulesFileSets).DefaultDescription.super_string_view._M_len = 0x1a;
  (this->CxxModulesFileSets).DefaultDescription.super_string_view._M_str =
       "The default C++ module set";
  (this->CxxModulesFileSets).ArbitraryDescription.super_string_view._M_len = 0xe;
  (this->CxxModulesFileSets).ArbitraryDescription.super_string_view._M_str = "C++ module set";
  (this->CxxModulesFileSets).SelfEntries.PropertyName.super_string_view._M_len = 0xf;
  (this->CxxModulesFileSets).SelfEntries.PropertyName.super_string_view._M_str = "CXX_MODULE_SETS";
  (this->CxxModulesFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CxxModulesFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CxxModulesFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CxxModulesFileSets).InterfaceEntries.PropertyName.super_string_view._M_len = 0x19;
  (this->CxxModulesFileSets).InterfaceEntries.PropertyName.super_string_view._M_str =
       "INTERFACE_CXX_MODULE_SETS";
  (this->CxxModulesFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CxxModulesFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CxxModulesFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_c0);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

cmTargetInternals::cmTargetInternals()
  : IncludeDirectories("INCLUDE_DIRECTORIES"_s)
  , CompileOptions("COMPILE_OPTIONS"_s)
  , CompileFeatures("COMPILE_FEATURES"_s)
  , CompileDefinitions("COMPILE_DEFINITIONS"_s)
  , PrecompileHeaders("PRECOMPILE_HEADERS"_s)
  , Sources("SOURCES"_s, UsageRequirementProperty::AppendEmpty::Yes)
  , LinkOptions("LINK_OPTIONS"_s)
  , LinkDirectories("LINK_DIRECTORIES"_s)
  , LinkLibraries("LINK_LIBRARIES"_s)
  , InterfaceLinkLibraries("INTERFACE_LINK_LIBRARIES"_s)
  , InterfaceLinkLibrariesDirect("INTERFACE_LINK_LIBRARIES_DIRECT"_s)
  , InterfaceLinkLibrariesDirectExclude(
      "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE"_s)
  , ImportedCxxModulesIncludeDirectories(
      "IMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES"_s)
  , ImportedCxxModulesCompileDefinitions(
      "IMPORTED_CXX_MODULES_COMPILE_DEFINITIONS"_s)
  , ImportedCxxModulesCompileFeatures(
      "IMPORTED_CXX_MODULES_COMPILE_FEATURES"_s)
  , ImportedCxxModulesCompileOptions("IMPORTED_CXX_MODULES_COMPILE_OPTIONS"_s)
  , ImportedCxxModulesLinkLibraries("IMPORTED_CXX_MODULES_LINK_LIBRARIES"_s)
  , HeadersFileSets("HEADERS"_s, "HEADER_DIRS"_s, "HEADER_SET"_s,
                    "HEADER_DIRS_"_s, "HEADER_SET_"_s, "Header"_s,
                    "The default header set"_s, "Header set"_s,
                    FileSetEntries("HEADER_SETS"_s),
                    FileSetEntries("INTERFACE_HEADER_SETS"_s))
  , CxxModulesFileSets("CXX_MODULES"_s, "CXX_MODULE_DIRS"_s,
                       "CXX_MODULE_SET"_s, "CXX_MODULE_DIRS_"_s,
                       "CXX_MODULE_SET_"_s, "C++ module"_s,
                       "The default C++ module set"_s, "C++ module set"_s,
                       FileSetEntries("CXX_MODULE_SETS"_s),
                       FileSetEntries("INTERFACE_CXX_MODULE_SETS"_s))
{
}